

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::traverseKey
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  short *psVar1;
  SchemaInfo *pSVar2;
  MemoryManager *pMVar3;
  BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *this_00;
  bool bVar4;
  int iVar5;
  XMLSize_t index;
  XMLCh *toCheck;
  RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *pRVar6;
  undefined4 extraout_var;
  IdentityConstraint *valueToAdopt;
  RefVectorOf<xercesc_4_0::IdentityConstraint> *pRVar7;
  undefined4 extraout_var_00;
  long lVar8;
  XMLSize_t XVar9;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  
  pSVar2 = this->fSchemaInfo;
  if (icElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,icElem);
  }
  local_40.fSchemaInfo = pSVar2;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,icElem,0x1a,this,false,this->fNonXSAttList);
  toCheck = getElementAttValue(this,icElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  XVar9 = 0;
  if (toCheck != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toCheck + XVar9);
      XVar9 = XVar9 + 2;
    } while (*psVar1 != 0);
    XVar9 = ((long)XVar9 >> 1) - 1;
  }
  bVar4 = XMLChar1_0::isValidNCName(toCheck,XVar9);
  if (bVar4) {
    if (this->fIdentityConstraintNames ==
        (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar6 = (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x30,this->fMemoryManager);
      pMVar3 = this->fMemoryManager;
      pRVar6->fMemoryManager = pMVar3;
      pRVar6->fAdoptedElems = false;
      pRVar6->fBucketList = (RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)0x0;
      pRVar6->fHashModulus = 0x1d;
      pRVar6->fCount = 0;
      iVar5 = (*pMVar3->_vptr_MemoryManager[3])();
      pRVar6->fBucketList =
           (RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)
           CONCAT44(extraout_var,iVar5);
      memset((RefHash2KeysTableBucketElem<xercesc_4_0::IdentityConstraint> **)
             CONCAT44(extraout_var,iVar5),0,pRVar6->fHashModulus << 3);
      this->fIdentityConstraintNames = pRVar6;
    }
    else {
      bVar4 = RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
              containsKey(this->fIdentityConstraintNames,toCheck,this->fTargetNSURI);
      if (bVar4) {
        reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x82,toCheck,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_0033b3ee;
      }
    }
    valueToAdopt = (IdentityConstraint *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager)
    ;
    IC_Key::IC_Key((IC_Key *)valueToAdopt,toCheck,
                   ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,
                   this->fGrammarPoolMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
              (this->fIdentityConstraintNames,toCheck,this->fTargetNSURI,valueToAdopt);
    bVar4 = traverseIdentityConstraint(this,valueToAdopt,icElem);
    if (bVar4) {
      if (elemDecl->fIdentityConstraints == (RefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) {
        pRVar7 = (RefVectorOf<xercesc_4_0::IdentityConstraint> *)
                 XMemory::operator_new(0x30,(elemDecl->super_XMLElementDecl).fMemoryManager);
        pMVar3 = (elemDecl->super_XMLElementDecl).fMemoryManager;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>)._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__BaseRefVectorOf_00416308;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fAdoptedElems = true;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fCurCount = 0;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fMaxCount = 0x10;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fElemList =
             (IdentityConstraint **)0x0;
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fMemoryManager = pMVar3;
        iVar5 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,0x80);
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fElemList =
             (IdentityConstraint **)CONCAT44(extraout_var_00,iVar5);
        lVar8 = 0;
        do {
          (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>).fElemList[lVar8] =
               (IdentityConstraint *)0x0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        (pRVar7->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>)._vptr_BaseRefVectorOf =
             (_func_int **)&PTR__RefVectorOf_00416290;
        elemDecl->fIdentityConstraints = pRVar7;
      }
      this_00 = &elemDecl->fIdentityConstraints->
                 super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>;
      BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::ensureExtraCapacity(this_00,1);
      XVar9 = this_00->fCurCount;
      this_00->fElemList[XVar9] = valueToAdopt;
      this_00->fCurCount = XVar9 + 1;
      valueToAdopt->fNamespaceURI = this->fTargetNSURI;
      valueToAdopt = (IdentityConstraint *)0x0;
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
                (this->fIdentityConstraintNames,toCheck,this->fTargetNSURI,(IdentityConstraint *)0x0
                );
    }
    if (valueToAdopt != (IdentityConstraint *)0x0) {
      (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[1])(valueToAdopt);
    }
  }
  else {
    reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"key",toCheck,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
LAB_0033b3ee:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::traverseKey(const DOMElement* const icElem,
                                 SchemaElementDecl* const elemDecl) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        icElem, GeneralAttributeCheck::E_Key, this, false, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Create identity constraint
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(icElem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_KEY, name);
        return;
    }


    if (!fIdentityConstraintNames) {
        fIdentityConstraintNames = new (fMemoryManager) RefHash2KeysTableOf<IdentityConstraint>(29, (bool) false, fMemoryManager);
    }
    else if (fIdentityConstraintNames->containsKey(name, fTargetNSURI)) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_DuplicateDecl, name);
        return;
    }

    IC_Key* icKey = new (fGrammarPoolMemoryManager) IC_Key(name, elemDecl->getBaseName(), fGrammarPoolMemoryManager);
    Janitor<IC_Key> janKey(icKey);

    fIdentityConstraintNames->put((void*) name, fTargetNSURI, icKey);

    // -----------------------------------------------------------------------
    // Get selector and fields
    // -----------------------------------------------------------------------
    if (!traverseIdentityConstraint(icKey, icElem)) {

        fIdentityConstraintNames->put((void*) name, fTargetNSURI, 0);
        return;
    }

    // -----------------------------------------------------------------------
    // Add key to element declaration
    // -----------------------------------------------------------------------
    elemDecl->addIdentityConstraint(icKey);
    icKey->setNamespaceURI(fTargetNSURI);
    janKey.orphan();
}